

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O3

StringRef __thiscall mp::NameProvider::name(NameProvider *this,size_t index,size_t i2)

{
  pointer ppcVar1;
  char *pcVar2;
  pointer pcVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar8;
  Buffer<char> *pBVar9;
  Buffer<char> *pBVar10;
  ulong uVar11;
  StringRef SVar12;
  char *pcVar7;
  
  uVar11 = index + 1;
  ppcVar1 = (this->names_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (uVar11 < (ulong)((long)(this->names_).
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3)) {
    pcVar5 = ppcVar1[index];
    pcVar2 = ppcVar1[index + 1];
    pcVar7 = pcVar2 + -1;
    if ((pcVar5 < pcVar7) && (pcVar2[-2] == '\r')) {
      pcVar7 = pcVar2 + -2;
    }
    sVar6 = (long)pcVar7 - (long)pcVar5;
    goto LAB_0037a472;
  }
  pBVar9 = (this->writer_).super_BasicWriter<char>.buffer_;
  pBVar9->size_ = 0;
  uVar8 = pBVar9->capacity_;
  if (index < i2) {
    pcVar3 = (this->gen_name_)._M_dataplus._M_p;
    uVar4 = (this->gen_name_)._M_string_length;
    if (uVar8 < uVar4) {
      (**pBVar9->_vptr_Buffer)(pBVar9,uVar4);
      sVar6 = pBVar9->size_;
LAB_0037a35b:
      memmove(pBVar9->ptr_ + sVar6,pcVar3,uVar4);
      pBVar10 = (this->writer_).super_BasicWriter<char>.buffer_;
      uVar8 = pBVar10->capacity_;
    }
    else {
      pBVar10 = pBVar9;
      if (uVar4 != 0) {
        sVar6 = 0;
        goto LAB_0037a35b;
      }
    }
    pBVar9->size_ = uVar4;
    uVar4 = pBVar10->size_;
    if (uVar4 == uVar8) {
      (**pBVar10->_vptr_Buffer)(pBVar10,uVar8 + 1);
      uVar4 = pBVar10->size_;
    }
    pBVar10->size_ = uVar4 + 1;
    pBVar10->ptr_[uVar4] = '[';
  }
  else {
    pcVar3 = (this->gen_name_2_)._M_dataplus._M_p;
    uVar11 = (this->gen_name_2_)._M_string_length;
    if (uVar8 < uVar11) {
      (**pBVar9->_vptr_Buffer)(pBVar9,uVar11);
      sVar6 = pBVar9->size_;
LAB_0037a3ba:
      memmove(pBVar9->ptr_ + sVar6,pcVar3,uVar11);
      pBVar10 = (this->writer_).super_BasicWriter<char>.buffer_;
      uVar8 = pBVar10->capacity_;
    }
    else {
      pBVar10 = pBVar9;
      if (uVar11 != 0) {
        sVar6 = 0;
        goto LAB_0037a3ba;
      }
    }
    pBVar9->size_ = uVar11;
    uVar11 = pBVar10->size_;
    if (uVar11 == uVar8) {
      (**pBVar10->_vptr_Buffer)(pBVar10,uVar8 + 1);
      uVar11 = pBVar10->size_;
    }
    pBVar10->size_ = uVar11 + 1;
    pBVar10->ptr_[uVar11] = '[';
    uVar11 = (index - i2) + 1;
  }
  fmt::BasicWriter<char>::
  write_int<unsigned_long,fmt::IntFormatSpec<unsigned_long,fmt::TypeSpec<(char)0>,char>>
            (&(this->writer_).super_BasicWriter<char>,uVar11,
             (IntFormatSpec<unsigned_long,_fmt::TypeSpec<__x00_>,_char>)uVar11);
  pBVar9 = (this->writer_).super_BasicWriter<char>.buffer_;
  sVar6 = pBVar9->size_;
  if (sVar6 == pBVar9->capacity_) {
    (**pBVar9->_vptr_Buffer)(pBVar9,sVar6 + 1);
    sVar6 = pBVar9->size_;
  }
  pBVar9->size_ = sVar6 + 1;
  pBVar9->ptr_[sVar6] = ']';
  pBVar9 = (this->writer_).super_BasicWriter<char>.buffer_;
  sVar6 = pBVar9->size_;
  if (pBVar9->capacity_ < sVar6 + 1) {
    (**pBVar9->_vptr_Buffer)();
    pBVar9 = (this->writer_).super_BasicWriter<char>.buffer_;
  }
  pBVar9->ptr_[sVar6] = '\0';
  pBVar9 = (this->writer_).super_BasicWriter<char>.buffer_;
  pcVar5 = pBVar9->ptr_;
  sVar6 = pBVar9->size_;
LAB_0037a472:
  SVar12.size_ = sVar6;
  SVar12.data_ = pcVar5;
  return SVar12;
}

Assistant:

fmt::StringRef mp::NameProvider::name(
    std::size_t index, std::size_t i2) {
  if (index + 1 < names_.size()) {
    const char *name = names_[index];
    const auto* pos1past = names_[index + 1] - 1;
    assert( ('\n' == *pos1past) || ('\r' == *pos1past));
    if (pos1past>name && '\r' == *(pos1past-1))            // Windows
      --pos1past;
    return fmt::StringRef(name, pos1past - name);
  }
  writer_.clear();
  if (index>=i2)
    writer_ << gen_name_2_ << '[' << (index - i2 + 1) << ']';
  else
    writer_ << gen_name_ << '[' << (index + 1) << ']';
  return fmt::StringRef(writer_.c_str(), writer_.size());
}